

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw_pal.cpp
# Opt level: O0

void __thiscall
swrenderer::DrawWall1PalCommand::Execute(DrawWall1PalCommand *this,DrawerThread *thread)

{
  int iVar1;
  uint32_t uVar2;
  int iVar3;
  int pitch_00;
  int iVar4;
  uint8_t *puVar5;
  uint8_t *puVar6;
  uchar *dest_00;
  int iVar7;
  int pitch;
  int bits;
  uint8_t *dest;
  uint8_t *source;
  int count;
  uint8_t *colormap;
  uint32_t frac;
  uint32_t fracstep;
  DrawerThread *thread_local;
  DrawWall1PalCommand *this_local;
  
  iVar1 = *(int *)&(this->super_PalWall1Command).super_DrawerCommand.field_0xc;
  uVar2 = (this->super_PalWall1Command)._texturefrac;
  puVar5 = (this->super_PalWall1Command)._colormap;
  puVar6 = (this->super_PalWall1Command)._source;
  dest_00 = (this->super_PalWall1Command)._dest;
  iVar3 = (this->super_PalWall1Command)._fracbits;
  pitch_00 = (this->super_PalWall1Command)._pitch;
  source._4_4_ = DrawerThread::count_for_thread
                           (thread,(this->super_PalWall1Command).super_DrawerCommand._dest_y,
                            (this->super_PalWall1Command)._count);
  if (0 < source._4_4_) {
    _pitch = DrawerThread::dest_for_thread<unsigned_char>
                       (thread,(this->super_PalWall1Command).super_DrawerCommand._dest_y,pitch_00,
                        dest_00);
    iVar7 = DrawerThread::skipped_by_thread
                      (thread,(this->super_PalWall1Command).super_DrawerCommand._dest_y);
    colormap._0_4_ = iVar1 * iVar7 + uVar2;
    iVar7 = thread->num_cores;
    iVar4 = thread->num_cores;
    do {
      *_pitch = puVar5[puVar6[(uint)colormap >> ((byte)iVar3 & 0x1f)]];
      colormap._0_4_ = iVar7 * iVar1 + (uint)colormap;
      _pitch = _pitch + iVar4 * pitch_00;
      source._4_4_ = source._4_4_ + -1;
    } while (source._4_4_ != 0);
  }
  return;
}

Assistant:

void DrawWall1PalCommand::Execute(DrawerThread *thread)
	{
		uint32_t fracstep = _iscale;
		uint32_t frac = _texturefrac;
		uint8_t *colormap = _colormap;
		int count = _count;
		const uint8_t *source = _source;
		uint8_t *dest = _dest;
		int bits = _fracbits;
		int pitch = _pitch;

		count = thread->count_for_thread(_dest_y, count);
		if (count <= 0)
			return;

		dest = thread->dest_for_thread(_dest_y, pitch, dest);
		frac += fracstep * thread->skipped_by_thread(_dest_y);
		fracstep *= thread->num_cores;
		pitch *= thread->num_cores;

		do
		{
			*dest = colormap[source[frac >> bits]];
			frac += fracstep;
			dest += pitch;
		} while (--count);
	}